

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatchCommand.cxx
# Opt level: O3

void anon_unknown.dwarf_1920245::cmVariableWatchCommandVariableAccessed
               (string *variable,int access_type,void *client_data,char *newValue,cmMakefile *mf)

{
  uint *puVar1;
  pointer pcVar2;
  size_type sVar3;
  bool bVar4;
  string *psVar5;
  size_t sVar6;
  char *pcVar7;
  long lVar8;
  long *plVar9;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<cmListFileArgument> __l;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string accessString;
  string stack;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> newLFFArgs;
  cmExecutionStatus status;
  undefined1 local_321;
  uint *local_320;
  char *local_318;
  uint local_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  pointer *local_300;
  pointer local_2f8;
  undefined1 local_2f0;
  undefined7 uStack_2ef;
  pointer pbStack_2e8;
  uint *local_2e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2d8;
  uint local_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined1 *local_2c0;
  long *local_2b8;
  undefined8 local_2b0;
  undefined1 local_2a8;
  undefined7 uStack_2a7;
  undefined8 uStack_2a0;
  uint *local_298;
  char *local_290;
  uint local_288;
  undefined4 uStack_284;
  undefined4 uStack_280;
  undefined4 uStack_27c;
  long *local_278;
  pointer local_270;
  long local_268 [2];
  long *local_258;
  long local_250;
  long local_248 [2];
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_238;
  cmListFileFunction local_218;
  cmMakefile *local_200;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 local_1b8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1a0;
  ulong local_190;
  pointer *local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_180;
  long *local_168;
  undefined8 local_160;
  uint *local_158;
  char *local_150;
  uint local_148 [2];
  undefined8 uStack_140;
  char *local_138;
  undefined8 local_130;
  uint *local_128;
  char *local_120;
  uint local_118 [3];
  undefined4 uStack_10c;
  undefined4 local_108;
  undefined8 local_100;
  long *local_f8;
  undefined8 local_f0;
  long local_e8;
  undefined8 uStack_e0;
  undefined4 local_d8;
  undefined8 local_d0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_c0;
  bool local_a0;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_98;
  string local_78;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  
  if (*client_data == '\0') {
    *(undefined1 *)client_data = 1;
    psVar5 = cmVariableWatch::GetAccessAsString_abi_cxx11_(access_type);
    local_278 = local_268;
    pcVar2 = (psVar5->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_278,pcVar2,pcVar2 + psVar5->_M_string_length);
    puVar1 = (uint *)(local_1b8 + 0x10);
    local_1b8._0_8_ = puVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"LISTFILE_STACK","");
    psVar5 = (string *)cmMakefile::GetProperty(mf,(string *)local_1b8);
    if (psVar5 == (string *)0x0) {
      psVar5 = &cmValue::Empty_abi_cxx11_;
    }
    local_258 = local_248;
    pcVar2 = (psVar5->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_258,pcVar2,pcVar2 + psVar5->_M_string_length);
    if ((uint *)local_1b8._0_8_ != puVar1) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    if (*(long *)((long)client_data + 0x10) == 0) {
      pcVar7 = "";
      if (newValue != (char *)0x0) {
        pcVar7 = newValue;
      }
      local_1b8._0_8_ = (cmMakefile *)0xa;
      local_1b8._8_8_ = "Variable \"";
      local_1b8._16_8_ = 0;
      pcVar2 = (variable->_M_dataplus)._M_p;
      sVar3 = variable->_M_string_length;
      aStack_1a0._0_4_ = (undefined4)sVar3;
      aStack_1a0._4_2_ = (undefined2)(sVar3 >> 0x20);
      aStack_1a0._6_2_ = (undefined2)(sVar3 >> 0x30);
      aStack_1a0._8_4_ = SUB84(pcVar2,0);
      aStack_1a0._12_2_ = (undefined2)((ulong)pcVar2 >> 0x20);
      aStack_1a0._M_local_buf[0xe] = (char)((ulong)pcVar2 >> 0x30);
      aStack_1a0._M_local_buf[0xf] = (char)((ulong)pcVar2 >> 0x38);
      local_190 = 0;
      local_188 = (pointer *)0x15;
      local_180.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x8b96bc;
      local_180.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_180.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_270;
      local_168 = local_278;
      local_160 = 0;
      local_158 = (uint *)0xd;
      local_150 = " with value \"";
      local_148[0] = 0;
      local_148[1] = 0;
      uStack_140 = strlen(pcVar7);
      local_130 = 0;
      local_128 = (uint *)0x2;
      local_120 = "\".";
      local_118[0] = 0;
      local_118[1] = 0;
      views._M_len = 7;
      views._M_array = (iterator)local_1b8;
      local_138 = pcVar7;
      cmCatViews(&local_78,views);
      cmMakefile::IssueMessage(mf,LOG,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_1b8._0_8_ = puVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,"CMAKE_CURRENT_LIST_FILE","");
      local_2c0 = (undefined1 *)client_data;
      psVar5 = (string *)cmMakefile::GetDefinition(mf,(string *)local_1b8);
      if ((uint *)local_1b8._0_8_ != puVar1) {
        operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
      }
      pcVar2 = (variable->_M_dataplus)._M_p;
      local_2e0 = &local_2d0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2e0,pcVar2,pcVar2 + variable->_M_string_length);
      if (local_2e0 == &local_2d0) {
        aStack_1a0._0_4_ = uStack_2c8;
        aStack_1a0._4_2_ = (undefined2)uStack_2c4;
        aStack_1a0._6_2_ = (undefined2)((uint)uStack_2c4 >> 0x10);
        local_1b8._0_8_ = puVar1;
      }
      else {
        local_1b8._0_8_ = local_2e0;
      }
      local_1b8._8_8_ = local_2d8;
      local_2d8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_2d0 = local_2d0 & 0xffffff00;
      aStack_1a0._8_4_ = Quoted;
      local_190 = 0x7fffffffffffffff;
      local_300 = (pointer *)&local_2f0;
      local_2e0 = &local_2d0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_300,local_278,
                 (long)&(local_270->_M_dataplus)._M_p + (long)local_278);
      client_data = local_2c0;
      local_188 = &local_180.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      if (local_300 == (pointer *)&local_2f0) {
        local_180.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pbStack_2e8;
      }
      else {
        local_188 = local_300;
      }
      local_180.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_2f8;
      local_2f8 = (pointer)0x0;
      local_2f0 = 0;
      local_168 = (long *)CONCAT44(local_168._4_4_,1);
      local_160 = 0x7fffffffffffffff;
      pcVar7 = "";
      if (newValue != (char *)0x0) {
        pcVar7 = newValue;
      }
      local_320 = &local_310;
      local_300 = (pointer *)&local_2f0;
      local_200 = mf;
      sVar6 = strlen(pcVar7);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,pcVar7,pcVar7 + sVar6);
      local_158 = local_148;
      if (local_320 == &local_310) {
        uStack_140 = CONCAT44(uStack_304,uStack_308);
      }
      else {
        local_158 = local_320;
      }
      local_148[1] = uStack_30c;
      local_148[0] = local_310;
      local_150 = local_318;
      local_318 = (char *)0x0;
      local_310 = local_310 & 0xffffff00;
      local_138 = (char *)CONCAT44(local_138._4_4_,1);
      local_130 = 0x7fffffffffffffff;
      if (psVar5 == (string *)0x0) {
        psVar5 = &cmValue::Empty_abi_cxx11_;
      }
      pcVar2 = (psVar5->_M_dataplus)._M_p;
      local_320 = &local_310;
      local_298 = &local_288;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_298,pcVar2,pcVar2 + psVar5->_M_string_length);
      local_128 = local_118;
      if (local_298 == &local_288) {
        local_118[2] = uStack_280;
        uStack_10c = uStack_27c;
      }
      else {
        local_128 = local_298;
      }
      local_118[1] = uStack_284;
      local_118[0] = local_288;
      local_120 = local_290;
      local_290 = (char *)0x0;
      local_288 = local_288 & 0xffffff00;
      local_108 = 1;
      local_100 = 0x7fffffffffffffff;
      local_2b8 = (long *)&local_2a8;
      local_298 = &local_288;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b8,local_258,local_250 + (long)local_258);
      plVar9 = &local_e8;
      if (local_2b8 == (long *)&local_2a8) {
        uStack_e0 = uStack_2a0;
        local_f8 = plVar9;
      }
      else {
        local_f8 = local_2b8;
      }
      local_f0 = local_2b0;
      local_2b0 = 0;
      local_2a8 = 0;
      local_d8 = 1;
      local_d0 = 0x7fffffffffffffff;
      __l._M_len = 5;
      __l._M_array = (iterator)local_1b8;
      local_2b8 = (long *)&local_2a8;
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::vector
                (&local_238,__l,(allocator_type *)&local_78);
      lVar8 = -0xf0;
      do {
        if (plVar9 != (long *)plVar9[-2]) {
          operator_delete((long *)plVar9[-2],*plVar9 + 1);
        }
        plVar9 = plVar9 + -6;
        lVar8 = lVar8 + 0x30;
      } while (lVar8 != 0);
      if (local_2b8 != (long *)&local_2a8) {
        operator_delete(local_2b8,CONCAT71(uStack_2a7,local_2a8) + 1);
      }
      if (local_298 != &local_288) {
        operator_delete(local_298,CONCAT44(uStack_284,local_288) + 1);
      }
      if (local_320 != &local_310) {
        operator_delete(local_320,CONCAT44(uStack_30c,local_310) + 1);
      }
      if (local_300 != (pointer *)&local_2f0) {
        operator_delete(local_300,CONCAT71(uStack_2ef,local_2f0) + 1);
      }
      if (local_2e0 != &local_2d0) {
        operator_delete(local_2e0,CONCAT44(uStack_2cc,local_2d0) + 1);
      }
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,*(long *)((long)client_data + 8),
                 *(long *)((long)client_data + 0x10) + *(long *)((long)client_data + 8));
      local_98.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_238.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_98.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_238.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_98.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_238.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_238.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_238.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_78._M_dataplus._M_p = (pointer)0x7fffffffffffffff;
      local_1f8._M_dataplus._M_p = (pointer)0x7fffffffffffffff;
      local_1b8._0_8_ = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<cmListFileFunction::Implementation,std::allocator<cmListFileFunction::Implementation>,std::__cxx11::string,long&,long&,std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 8),
                 (Implementation **)local_1b8,
                 (allocator<cmListFileFunction::Implementation> *)&local_321,&local_1d8,
                 (long *)&local_78,(long *)&local_1f8,&local_98);
      local_218.Impl.
      super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_1b8._0_8_;
      local_218.Impl.
      super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_;
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      local_1b8._0_8_ = local_200;
      aStack_1a0._0_4_ = 0x6e6b6e75;
      aStack_1a0._4_2_ = 0x776f;
      aStack_1a0._6_2_ = 0x206e;
      aStack_1a0._8_4_ = 0x6f727265;
      aStack_1a0._12_2_ = 0x2e72;
      local_1b8._16_8_ = 0xe;
      aStack_1a0._M_local_buf[0xe] = '\0';
      local_188 = (pointer *)((ulong)local_188 & 0xffffffffffffff00);
      local_180.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_180.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_180.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_190 = local_190 & 0xffffffff00000000;
      local_a0 = false;
      local_1b8._8_8_ = &aStack_1a0;
      bVar4 = cmMakefile::ExecuteCommand
                        (local_200,&local_218,(cmExecutionStatus *)local_1b8,
                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_c0);
      if (local_a0 == true) {
        local_a0 = false;
        if (local_c0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_c0._M_value + 0x10)) {
          operator_delete((void *)local_c0._M_value._M_dataplus._M_p,local_c0._16_8_ + 1);
        }
      }
      if (!bVar4) {
        local_78._M_dataplus._M_p = (pointer)0x56;
        local_78._M_string_length = 0x8b965a;
        local_78.field_2._M_allocated_capacity = 0;
        local_58 = *(undefined8 *)((long)client_data + 8);
        local_78.field_2._8_8_ = *(undefined8 *)((long)client_data + 0x10);
        local_50 = 0;
        local_48 = 2;
        local_40 = "\".";
        local_38 = 0;
        views_00._M_len = 3;
        views_00._M_array = (iterator)&local_78;
        cmCatViews(&local_1f8,views_00);
        cmSystemTools::Error(&local_1f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_180);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._8_8_ != &aStack_1a0) {
        operator_delete((void *)local_1b8._8_8_,
                        CONCAT26(aStack_1a0._6_2_,CONCAT24(aStack_1a0._4_2_,aStack_1a0._0_4_)) + 1);
      }
      if (local_218.Impl.
          super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_218.Impl.
                   super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_238);
    }
    *(undefined1 *)client_data = 0;
    if (local_258 != local_248) {
      operator_delete(local_258,local_248[0] + 1);
    }
    if (local_278 != local_268) {
      operator_delete(local_278,local_268[0] + 1);
    }
  }
  return;
}

Assistant:

void cmVariableWatchCommandVariableAccessed(const std::string& variable,
                                            int access_type, void* client_data,
                                            const char* newValue,
                                            const cmMakefile* mf)
{
  cmVariableWatchCallbackData* data =
    static_cast<cmVariableWatchCallbackData*>(client_data);

  if (data->InCallback) {
    return;
  }
  data->InCallback = true;

  auto accessString = cmVariableWatch::GetAccessAsString(access_type);

  /// Ultra bad!!
  cmMakefile* makefile = const_cast<cmMakefile*>(mf);

  std::string stack = *mf->GetProperty("LISTFILE_STACK");
  if (!data->Command.empty()) {
    cmValue const currentListFile =
      mf->GetDefinition("CMAKE_CURRENT_LIST_FILE");
    const auto fakeLineNo =
      std::numeric_limits<decltype(cmListFileArgument::Line)>::max();

    std::vector<cmListFileArgument> newLFFArgs{
      { variable, cmListFileArgument::Quoted, fakeLineNo },
      { accessString, cmListFileArgument::Quoted, fakeLineNo },
      { newValue ? newValue : "", cmListFileArgument::Quoted, fakeLineNo },
      { *currentListFile, cmListFileArgument::Quoted, fakeLineNo },
      { stack, cmListFileArgument::Quoted, fakeLineNo }
    };

    cmListFileFunction newLFF{ data->Command, fakeLineNo, fakeLineNo,
                               std::move(newLFFArgs) };
    cmExecutionStatus status(*makefile);
    if (!makefile->ExecuteCommand(newLFF, status)) {
      cmSystemTools::Error(
        cmStrCat("Error in cmake code at\nUnknown:0:\nA command failed "
                 "during the invocation of callback \"",
                 data->Command, "\"."));
    }
  } else {
    makefile->IssueMessage(
      MessageType::LOG,
      cmStrCat("Variable \"", variable, "\" was accessed using ", accessString,
               " with value \"", (newValue ? newValue : ""), "\"."));
  }

  data->InCallback = false;
}